

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O3

void __thiscall Win32MakefileGenerator::processRcFileVar(Win32MakefileGenerator *this)

{
  QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *this_00;
  QString file;
  QString string;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  undefined8 uVar9;
  Data *pDVar10;
  bool bVar11;
  char cVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  ProStringList *pPVar16;
  pointer pQVar17;
  QTextStream *pQVar18;
  QString *pQVar19;
  QList<ProString> *pQVar20;
  iterator iVar21;
  QMovableArrayOps<ProString> *this_01;
  ProStringList *pPVar22;
  ProString *icon;
  ProString *pPVar23;
  QMakeProject *pQVar24;
  QDir *this_02;
  int iVar25;
  ulong uVar26;
  char *pcVar27;
  ProString *this_03;
  ProString *this_04;
  long lVar28;
  MakefileGenerator *pMVar29;
  long in_FS_OFFSET;
  bool bVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QAnyStringView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QStringView QVar45;
  QLatin1String QVar46;
  QByteArrayView QVar47;
  QStringView QVar48;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QFileInfo fi;
  bool ok;
  QString QStackY_5b8;
  long lStackY_5a0;
  QDir *pQStackY_598;
  ProString *pPStackY_590;
  undefined8 in_stack_fffffffffffffa78;
  MakefileGenerator *pMVar49;
  undefined4 uVar50;
  QArrayData *local_570;
  QArrayData *local_568;
  ProKey local_548;
  ProString local_518;
  ProKey local_4e8;
  undefined1 local_4b8 [64];
  QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> local_478;
  QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> local_408;
  char (*local_3a0) [10];
  undefined1 local_398 [56];
  ProString local_360;
  char (*local_330) [10];
  char (*local_328) [4];
  QString local_318;
  QArrayData *local_2f8;
  Data *pDStack_2f0;
  Data *local_2e8;
  QArrayData *local_2d8;
  Data *pDStack_2d0;
  Data *local_2c8;
  QArrayData *local_2b8;
  Data *pDStack_2b0;
  Data *local_2a8;
  ProString local_298;
  QArrayData *local_268;
  Data *pDStack_260;
  Data *local_258;
  QArrayData *local_248;
  Data *pDStack_240;
  Data *local_238;
  QArrayData *local_228;
  Data *pDStack_220;
  Data *local_218;
  QArrayData *local_208;
  Data *pDStack_200;
  Data *local_1f8;
  QArrayData *local_1e8;
  Data *pDStack_1e0;
  Data *local_1d8;
  QArrayDataPointer<ProString> local_1c8;
  QArrayDataPointer<QString> local_1a8;
  QArrayData *local_188;
  Data *pDStack_180;
  Data *local_178;
  QArrayDataPointer<QString> local_168;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  QArrayData *local_138;
  void *pvStack_130;
  Data *local_128;
  ProKey local_118;
  ProKey local_e8;
  ProKey local_b8;
  ProKey local_88;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Option::qmake_mode == QMAKE_GENERATE_NOTHING) goto LAB_0025b4ea;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar24 = (this->super_MakefileGenerator).project;
  pPStackY_590 = (ProString *)0x258221;
  ProKey::ProKey((ProKey *)&local_408,"QMAKE_MANIFEST");
  pPStackY_590 = (ProString *)0x258237;
  QMakeEvaluator::first((ProString *)local_398,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
  pPStackY_590 = (ProString *)0x258242;
  ProString::toQString(&local_58,(ProString *)local_398);
  if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      pPStackY_590 = (ProString *)0x258267;
      QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
    }
  }
  if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      pPStackY_590 = (ProString *)0x258290;
      QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar24 = (this->super_MakefileGenerator).project;
  pPStackY_590 = (ProString *)0x2582ae;
  ProKey::ProKey((ProKey *)local_398,"VERSION");
  pPStackY_590 = (ProString *)0x2582b9;
  pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
  lVar28 = (pPVar16->super_QList<ProString>).d.size;
  iVar25 = (int)lVar28;
  uVar50 = (undefined4)((ulong)lVar28 >> 0x20);
  pMVar29 = &this->super_MakefileGenerator;
  if (lVar28 == 0) {
    pQVar24 = (this->super_MakefileGenerator).project;
    pPStackY_590 = (ProString *)0x2582ea;
    ProKey::ProKey(&local_88,"RC_ICONS");
    pPStackY_590 = (ProString *)0x2582f5;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,&local_88);
    if (((pPVar16->super_QList<ProString>).d.size != 0) ||
       ((undefined1 *)local_58.d.size != (undefined1 *)0x0)) goto LAB_0025830b;
    bVar1 = false;
    bVar11 = false;
    bVar2 = false;
    bVar3 = false;
LAB_002583d8:
    pQVar24 = pMVar29->project;
    pPStackY_590 = (ProString *)0x2583fb;
    ProKey::ProKey((ProKey *)&local_408,"QMAKE_WRITE_DEFAULT_RC");
    pPStackY_590 = (ProString *)0x258406;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
    bVar30 = (pPVar16->super_QList<ProString>).d.size != 0;
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x258433;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar11) {
LAB_00258438:
      if (&(local_118.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_118.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258461;
          QArrayData::deallocate(&(local_118.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      goto LAB_00258461;
    }
  }
  else {
LAB_0025830b:
    pQVar24 = (this->super_MakefileGenerator).project;
    pPStackY_590 = (ProString *)0x258329;
    ProKey::ProKey(&local_b8,"RC_FILE");
    pPStackY_590 = (ProString *)0x258334;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,&local_b8);
    if ((pPVar16->super_QList<ProString>).d.size != 0) {
      bVar3 = true;
      bVar1 = false;
      bVar11 = false;
      bVar2 = false;
      goto LAB_002583d8;
    }
    pQVar24 = (this->super_MakefileGenerator).project;
    pPStackY_590 = (ProString *)0x25836a;
    ProKey::ProKey(&local_e8,"RES_FILE");
    pPStackY_590 = (ProString *)0x258375;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,&local_e8);
    if ((pPVar16->super_QList<ProString>).d.size != 0) {
      bVar1 = false;
LAB_002583d5:
      bVar11 = false;
      bVar2 = true;
      bVar3 = true;
      goto LAB_002583d8;
    }
    pQVar24 = (this->super_MakefileGenerator).project;
    pPStackY_590 = (ProString *)0x2583aa;
    QVar31.m_data = (storage_type *)0x18;
    QVar31.m_size = (qsizetype)&local_408;
    QString::fromUtf8(QVar31);
    local_570 = &(local_408.a.a.m_string.d.d)->super_QArrayData;
    pPStackY_590 = (ProString *)0x2583c7;
    config.m_data = local_408.a.a.m_string.d.ptr;
    config.m_size = local_408.a.a.m_string.d.size;
    bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config,false);
    if (bVar11) {
      bVar1 = true;
      goto LAB_002583d5;
    }
    pQVar24 = (this->super_MakefileGenerator).project;
    pPStackY_590 = (ProString *)0x25a637;
    QVar44.m_data = (storage_type *)0x6;
    QVar44.m_size = (qsizetype)&local_408;
    QString::fromUtf8(QVar44);
    local_568 = &(local_408.a.a.m_string.d.d)->super_QArrayData;
    pPStackY_590 = (ProString *)0x25a654;
    config_01.m_data = local_408.a.a.m_string.d.ptr;
    config_01.m_size = local_408.a.a.m_string.d.size;
    bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_01,false);
    bVar1 = true;
    if (!bVar11) {
      pQVar24 = (this->super_MakefileGenerator).project;
      pPStackY_590 = (ProString *)0x25a696;
      ProKey::ProKey(&local_118,"QMAKE_APP_FLAG");
      pPStackY_590 = (ProString *)0x25a6a1;
      pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,&local_118);
      bVar1 = true;
      bVar11 = true;
      bVar2 = true;
      bVar3 = true;
      bVar30 = true;
      if ((pPVar16->super_QList<ProString>).d.size == 0) goto LAB_002583d8;
      goto LAB_00258438;
    }
    bVar2 = true;
    bVar3 = true;
    bVar30 = true;
LAB_00258461:
    if (local_568 != (QArrayData *)0x0) {
      LOCK();
      (local_568->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_568->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_568->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25847f;
        QArrayData::deallocate(local_568,2,0x10);
      }
    }
  }
  if ((bVar1) && (local_570 != (QArrayData *)0x0)) {
    LOCK();
    (local_570->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_570->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_570->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      pPStackY_590 = (ProString *)0x2584a2;
      QArrayData::deallocate(local_570,2,0x10);
    }
  }
  if ((bVar2) && (&(local_e8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0))
  {
    LOCK();
    ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      pPStackY_590 = (ProString *)0x2584d0;
      QArrayData::deallocate(&(local_e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pMVar49 = pMVar29;
  if (bVar3) {
    if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x258503;
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    lVar28 = CONCAT44(uVar50,iVar25);
  }
  else {
    lVar28 = CONCAT44(uVar50,iVar25);
  }
  if ((lVar28 == 0) &&
     (&(local_88.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      pPStackY_590 = (ProString *)0x258543;
      QArrayData::deallocate(&(local_88.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      pPStackY_590 = (ProString *)0x25856c;
      QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
    }
  }
  if (bVar30) {
    local_138 = (QArrayData *)0x0;
    pvStack_130 = (void *)0x0;
    local_128 = (Data *)0x0;
    local_148 = 0xaaaaaaaa;
    uStack_144 = 0xaaaaaaaa;
    uStack_140 = 0xaaaaaaaa;
    uStack_13c = 0xaaaaaaaa;
    pPStackY_590 = (ProString *)0x2585a6;
    QTextStream::QTextStream((QTextStream *)&local_148,&local_138,2);
    local_168.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_168.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar24 = pMVar29->project;
    pPStackY_590 = (ProString *)0x2585e4;
    ProKey::ProKey((ProKey *)&local_408,"VERSION");
    pPStackY_590 = (ProString *)0x2585fa;
    QMakeEvaluator::first
              ((ProString *)local_398,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
    pPStackY_590 = (ProString *)0x25860d;
    ProString::toQString((QString *)local_4b8,(ProString *)local_398);
    pPStackY_590 = (ProString *)0x258629;
    QVar32.m_data = (storage_type *)0x1;
    QVar32.m_size = (qsizetype)(local_4b8 + 0x40);
    QString::fromUtf8(QVar32);
    local_298.m_string.d.d = local_478.a.a.m_string.d.d;
    local_298.m_string.d.ptr = local_478.a.a.m_string.d.ptr;
    local_298.m_string.d.size = local_478.a.a.m_string.d.size;
    pPStackY_590 = (ProString *)0x25865c;
    QString::split(&local_168,(QString *)local_4b8,&local_298,1,1);
    if (&(local_298.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_590 = (ProString *)0x258681;
        QArrayData::deallocate(&(local_298.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x2586aa;
        QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x2586d3;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x2586fc;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((int)local_168.size < 4) {
      iVar25 = (int)local_168.size + -4;
      do {
        pPStackY_590 = (ProString *)0x25873e;
        QVar33.m_data = (storage_type *)0x1;
        QVar33.m_size = (qsizetype)local_398;
        QString::fromUtf8(QVar33);
        local_408.a.a.m_string.d.d = (Data *)local_398._0_8_;
        local_408.a.a.m_string.d.ptr = (char16_t *)local_398._8_8_;
        local_408.a.a.m_string.d.size = local_398._16_8_;
        pPStackY_590 = (ProString *)0x258771;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_168,local_168.size,(QString *)&local_408);
        pPStackY_590 = (ProString *)0x258779;
        QList<QString>::end((QList<QString> *)&local_168);
        if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            pPStackY_590 = (ProString *)0x2587a2;
            QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 != 0);
    }
    local_178 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_188 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pDStack_180 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_398._0_2_ = 0x2e;
    pPStackY_590 = (ProString *)0x2587e5;
    QtPrivate::QStringList_join((QList *)&local_188,(QChar *)&local_168,(longlong)local_398);
    local_1a8.d = (Data *)0x0;
    local_1a8.ptr = (QString *)0x0;
    local_1a8.size = 0;
    local_1c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_1c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_1c8.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x258836;
    pMVar29 = pMVar49;
    ProKey::ProKey((ProKey *)local_398,"RC_ICONS");
    pPStackY_590 = (ProString *)0x258841;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    local_1c8.d = (pPVar16->super_QList<ProString>).d.d;
    local_1c8.ptr = (pPVar16->super_QList<ProString>).d.ptr;
    local_1c8.size = (pPVar16->super_QList<ProString>).d.size;
    if (local_1c8.d != (Data *)0x0) {
      LOCK();
      ((local_1c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x258895;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x2588aa;
    QList<QString>::reserve((QList<QString> *)&local_1a8,local_1c8.size);
    if (local_1c8.size != 0) {
      lVar28 = local_1c8.size * 0x30;
      pPVar23 = local_1c8.ptr;
      do {
        pPStackY_590 = (ProString *)0x2588ee;
        ProString::toQString((QString *)&local_408,pPVar23);
        pPStackY_590 = (ProString *)0x258907;
        MakefileGenerator::fileFixify
                  ((QString *)local_398,pMVar49,(QString *)&local_408,(FileFixifyTypes)0x4,true);
        pPStackY_590 = (ProString *)0x25891a;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)local_398);
        pPStackY_590 = (ProString *)0x258922;
        QList<QString>::end((QList<QString> *)&local_1a8);
        if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            pPStackY_590 = (ProString *)0x25894b;
            QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
          }
        }
        if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            pPStackY_590 = (ProString *)0x258974;
            QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pPVar23 = pPVar23 + 1;
        lVar28 = lVar28 + -0x30;
      } while (lVar28 != 0);
    }
    local_1e8 = (QArrayData *)0x0;
    pDStack_1e0 = (Data *)0x0;
    local_1d8 = (Data *)0x0;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x2589b7;
    ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_COMPANY");
    pPStackY_590 = (ProString *)0x2589c2;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    lVar28 = (pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x2589ea;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (lVar28 != 0) {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x258a11;
      ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_COMPANY");
      pPStackY_590 = (ProString *)0x258a1c;
      pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
      pPStackY_590 = (ProString *)0x258a34;
      ProStringList::join((QString *)&local_408,pPVar16,(QChar)0x20);
      pDVar10 = pDStack_1e0;
      pQVar4 = local_1e8;
      qVar7 = local_408.a.a.m_string.d.size;
      pDVar5 = local_408.a.a.m_string.d.d;
      local_408.a.a.m_string.d.d = (Data *)local_1e8;
      local_1e8 = &pDVar5->super_QArrayData;
      pDStack_1e0 = (Data *)local_408.a.a.m_string.d.ptr;
      local_408.a.a.m_string.d.ptr = (char16_t *)pDVar10;
      local_408.a.a.m_string.d.size = (qsizetype)local_1d8;
      local_1d8 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258a83;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258aac;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
    }
    local_208 = (QArrayData *)0x0;
    pDStack_200 = (Data *)0x0;
    local_1f8 = (Data *)0x0;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x258ae1;
    ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_DESCRIPTION");
    pPStackY_590 = (ProString *)0x258aec;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    lVar28 = (pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x258b14;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (lVar28 != 0) {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x258b3b;
      ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_DESCRIPTION");
      pPStackY_590 = (ProString *)0x258b46;
      pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
      pPStackY_590 = (ProString *)0x258b5e;
      ProStringList::join((QString *)&local_408,pPVar16,(QChar)0x20);
      pDVar10 = pDStack_200;
      pQVar4 = local_208;
      qVar7 = local_408.a.a.m_string.d.size;
      pDVar5 = local_408.a.a.m_string.d.d;
      local_408.a.a.m_string.d.d = (Data *)local_208;
      local_208 = &pDVar5->super_QArrayData;
      pDStack_200 = (Data *)local_408.a.a.m_string.d.ptr;
      local_408.a.a.m_string.d.ptr = (char16_t *)pDVar10;
      local_408.a.a.m_string.d.size = (qsizetype)local_1f8;
      local_1f8 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258bad;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258bd6;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
    }
    local_228 = (QArrayData *)0x0;
    pDStack_220 = (Data *)0x0;
    local_218 = (Data *)0x0;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x258c0b;
    ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_COPYRIGHT");
    pPStackY_590 = (ProString *)0x258c16;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    lVar28 = (pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x258c3e;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (lVar28 != 0) {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x258c65;
      ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_COPYRIGHT");
      pPStackY_590 = (ProString *)0x258c70;
      pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
      pPStackY_590 = (ProString *)0x258c88;
      ProStringList::join((QString *)&local_408,pPVar16,(QChar)0x20);
      pDVar10 = pDStack_220;
      pQVar4 = local_228;
      qVar7 = local_408.a.a.m_string.d.size;
      pDVar5 = local_408.a.a.m_string.d.d;
      local_408.a.a.m_string.d.d = (Data *)local_228;
      local_228 = &pDVar5->super_QArrayData;
      pDStack_220 = (Data *)local_408.a.a.m_string.d.ptr;
      local_408.a.a.m_string.d.ptr = (char16_t *)pDVar10;
      local_408.a.a.m_string.d.size = (qsizetype)local_218;
      local_218 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258cd7;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258d00;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
    }
    local_248 = (QArrayData *)0x0;
    pDStack_240 = (Data *)0x0;
    local_238 = (Data *)0x0;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x258d35;
    ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_PRODUCT");
    pPStackY_590 = (ProString *)0x258d40;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    lVar28 = (pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x258d68;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (lVar28 == 0) {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x258e46;
      ProKey::ProKey((ProKey *)&local_408,"TARGET");
      pPStackY_590 = (ProString *)0x258e5c;
      QMakeEvaluator::first
                ((ProString *)local_398,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
      pPStackY_590 = (ProString *)0x258e6f;
      ProString::toQString((QString *)(local_4b8 + 0x40),(ProString *)local_398);
      pDVar10 = pDStack_240;
      pQVar4 = local_248;
      qVar7 = local_478.a.a.m_string.d.size;
      pDVar5 = local_478.a.a.m_string.d.d;
      local_478.a.a.m_string.d.d = (Data *)local_248;
      local_248 = &pDVar5->super_QArrayData;
      pDStack_240 = (Data *)local_478.a.a.m_string.d.ptr;
      local_478.a.a.m_string.d.ptr = (char16_t *)pDVar10;
      local_478.a.a.m_string.d.size = (qsizetype)local_238;
      local_238 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258ebe;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258ee7;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
      if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        iVar25 = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar4 = &(local_408.a.a.m_string.d.d)->super_QArrayData;
        goto joined_r0x00258ef7;
      }
    }
    else {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x258d8f;
      ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_PRODUCT");
      pPStackY_590 = (ProString *)0x258d9a;
      pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
      pPStackY_590 = (ProString *)0x258db2;
      ProStringList::join((QString *)&local_408,pPVar16,(QChar)0x20);
      pDVar10 = pDStack_240;
      pQVar4 = local_248;
      qVar7 = local_408.a.a.m_string.d.size;
      pDVar5 = local_408.a.a.m_string.d.d;
      local_408.a.a.m_string.d.d = (Data *)local_248;
      local_248 = &pDVar5->super_QArrayData;
      pDStack_240 = (Data *)local_408.a.a.m_string.d.ptr;
      local_408.a.a.m_string.d.ptr = (char16_t *)pDVar10;
      local_408.a.a.m_string.d.size = (qsizetype)local_238;
      local_238 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x258e01;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        iVar25 = (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar4 = (QArrayData *)local_398._0_8_;
joined_r0x00258ef7:
        if (iVar25 == 0) {
          pPStackY_590 = (ProString *)0x258f10;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    local_268 = (QArrayData *)0x0;
    pDStack_260 = (Data *)0x0;
    local_258 = (Data *)0x0;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x258f45;
    ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_ORIGINAL_FILENAME");
    pPStackY_590 = (ProString *)0x258f50;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    lVar28 = (pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x258f78;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (lVar28 == 0) {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x259056;
      ProKey::ProKey((ProKey *)(local_4b8 + 0x40),"TARGET");
      pPStackY_590 = (ProString *)0x25906c;
      QMakeEvaluator::first
                ((ProString *)&local_408,&pQVar24->super_QMakeEvaluator,(ProKey *)(local_4b8 + 0x40)
                );
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x25908a;
      ProKey::ProKey((ProKey *)&local_298,"TARGET_EXT");
      pPStackY_590 = (ProString *)0x2590a0;
      QMakeEvaluator::first
                ((ProString *)local_4b8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_298);
      pPStackY_590 = (ProString *)0x2590b3;
      ProString::ProString((ProString *)local_398,(ProString *)&local_408);
      pPStackY_590 = (ProString *)0x2590c3;
      ProString::ProString((ProString *)(local_398 + 0x30),(ProString *)local_4b8);
      pPStackY_590 = (ProString *)0x2590d6;
      QStringBuilder<ProString,_ProString>::convertTo<QString>
                ((QString *)&local_4e8,(QStringBuilder<ProString,_ProString> *)local_398);
      pDVar10 = pDStack_260;
      pQVar4 = local_268;
      qVar7 = local_4e8.super_ProString.m_string.d.size;
      pDVar5 = local_4e8.super_ProString.m_string.d.d;
      local_4e8.super_ProString.m_string.d.d = (Data *)local_268;
      local_268 = &pDVar5->super_QArrayData;
      pDStack_260 = (Data *)local_4e8.super_ProString.m_string.d.ptr;
      local_4e8.super_ProString.m_string.d.ptr = (char16_t *)pDVar10;
      local_4e8.super_ProString.m_string.d.size = (qsizetype)local_258;
      local_258 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x259127;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      pPStackY_590 = (ProString *)0x259134;
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)local_398);
      if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x25915d;
          QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
        }
      }
      if (&(local_298.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          pPStackY_590 = (ProString *)0x259186;
          QArrayData::deallocate(&(local_298.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_590 = (ProString *)0x2591af;
          QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        iVar25 = ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar4 = &(local_478.a.a.m_string.d.d)->super_QArrayData;
        goto joined_r0x002591bf;
      }
    }
    else {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x258f9f;
      ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_ORIGINAL_FILENAME");
      pPStackY_590 = (ProString *)0x258faa;
      pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
      pPStackY_590 = (ProString *)0x258fc2;
      ProStringList::join((QString *)&local_408,pPVar16,(QChar)0x20);
      pDVar10 = pDStack_260;
      pQVar4 = local_268;
      qVar7 = local_408.a.a.m_string.d.size;
      pDVar5 = local_408.a.a.m_string.d.d;
      local_408.a.a.m_string.d.d = (Data *)local_268;
      local_268 = &pDVar5->super_QArrayData;
      pDStack_260 = (Data *)local_408.a.a.m_string.d.ptr;
      local_408.a.a.m_string.d.ptr = (char16_t *)pDVar10;
      local_408.a.a.m_string.d.size = (qsizetype)local_258;
      local_258 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x259011;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        iVar25 = (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar4 = (QArrayData *)local_398._0_8_;
joined_r0x002591bf:
        if (iVar25 == 0) {
          pPStackY_590 = (ProString *)0x2591d8;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    local_2b8 = (QArrayData *)0x0;
    pDStack_2b0 = (Data *)0x0;
    local_2a8 = (Data *)0x0;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x25920d;
    ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_INTERNALNAME");
    pPStackY_590 = (ProString *)0x259218;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    lVar28 = (pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x259240;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (lVar28 != 0) {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x259267;
      ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_INTERNALNAME");
      pPStackY_590 = (ProString *)0x259272;
      pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
      pPStackY_590 = (ProString *)0x25928a;
      ProStringList::join((QString *)&local_408,pPVar16,(QChar)0x20);
      pDVar10 = pDStack_2b0;
      pQVar4 = local_2b8;
      qVar7 = local_408.a.a.m_string.d.size;
      pDVar5 = local_408.a.a.m_string.d.d;
      local_408.a.a.m_string.d.d = (Data *)local_2b8;
      local_2b8 = &pDVar5->super_QArrayData;
      pDStack_2b0 = (Data *)local_408.a.a.m_string.d.ptr;
      local_408.a.a.m_string.d.ptr = (char16_t *)pDVar10;
      local_408.a.a.m_string.d.size = (qsizetype)local_2a8;
      local_2a8 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x2592d9;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x259302;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
    }
    local_2d8 = (QArrayData *)0x0;
    pDStack_2d0 = (Data *)0x0;
    local_2c8 = (Data *)0x0;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x259337;
    ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_COMMENTS");
    pPStackY_590 = (ProString *)0x259342;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    lVar28 = (pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25936a;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (lVar28 != 0) {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x259391;
      ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_COMMENTS");
      pPStackY_590 = (ProString *)0x25939c;
      pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
      pPStackY_590 = (ProString *)0x2593b4;
      ProStringList::join((QString *)&local_408,pPVar16,(QChar)0x20);
      pDVar10 = pDStack_2d0;
      pQVar4 = local_2d8;
      qVar7 = local_408.a.a.m_string.d.size;
      pDVar5 = local_408.a.a.m_string.d.d;
      local_408.a.a.m_string.d.d = (Data *)local_2d8;
      local_2d8 = &pDVar5->super_QArrayData;
      pDStack_2d0 = (Data *)local_408.a.a.m_string.d.ptr;
      local_408.a.a.m_string.d.ptr = (char16_t *)pDVar10;
      local_408.a.a.m_string.d.size = (qsizetype)local_2c8;
      local_2c8 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x259403;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x25942c;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
    }
    local_2f8 = (QArrayData *)0x0;
    pDStack_2f0 = (Data *)0x0;
    local_2e8 = (Data *)0x0;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x259461;
    ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_TRADEMARKS");
    pPStackY_590 = (ProString *)0x25946c;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    lVar28 = (pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x259494;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (lVar28 != 0) {
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x2594bb;
      ProKey::ProKey((ProKey *)local_398,"QMAKE_TARGET_TRADEMARKS");
      pPStackY_590 = (ProString *)0x2594c6;
      pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
      pPStackY_590 = (ProString *)0x2594de;
      ProStringList::join((QString *)&local_408,pPVar16,(QChar)0x20);
      pDVar10 = pDStack_2f0;
      pQVar4 = local_2f8;
      qVar7 = local_408.a.a.m_string.d.size;
      pDVar5 = local_408.a.a.m_string.d.d;
      local_408.a.a.m_string.d.d = (Data *)local_2f8;
      local_2f8 = &pDVar5->super_QArrayData;
      pDStack_2f0 = (Data *)local_408.a.a.m_string.d.ptr;
      local_408.a.a.m_string.d.ptr = (char16_t *)pDVar10;
      local_408.a.a.m_string.d.size = (qsizetype)local_2e8;
      local_2e8 = (Data *)qVar7;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x25952d;
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x259556;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
    }
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x259574;
    ProKey::ProKey((ProKey *)&local_408,"RC_LANG");
    pPStackY_590 = (ProString *)0x25958a;
    QMakeEvaluator::first
              ((ProString *)local_398,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
    if (local_398._28_4_ == 0) {
LAB_002595b9:
      iVar14 = 0x409;
    }
    else {
      local_478.a.a.m_string.d.d = (Data *)CONCAT71(local_478.a.a.m_string.d.d._1_7_,0xaa);
      pPStackY_590 = (ProString *)0x2595ae;
      iVar14 = ProString::toInt((ProString *)local_398,(bool *)(local_4b8 + 0x40),0);
      if ((char)local_478.a.a.m_string.d.d == '\0') goto LAB_002595b9;
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x2595ea;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x259613;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x259631;
    ProKey::ProKey((ProKey *)&local_408,"RC_CODEPAGE");
    pPStackY_590 = (ProString *)0x259647;
    QMakeEvaluator::first
              ((ProString *)local_398,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
    if (local_398._28_4_ == 0) {
LAB_00259676:
      iVar15 = 0x4b0;
    }
    else {
      local_478.a.a.m_string.d.d = (Data *)CONCAT71(local_478.a.a.m_string.d.d._1_7_,0xaa);
      pPStackY_590 = (ProString *)0x25966b;
      iVar15 = ProString::toInt((ProString *)local_398,(bool *)(local_4b8 + 0x40),0);
      if ((char)local_478.a.a.m_string.d.d == '\0') goto LAB_00259676;
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x2596a7;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x2596d0;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x2596e7;
    QTextStream::operator<<((QTextStream *)&local_148,"#include <windows.h>\n");
    pPStackY_590 = (ProString *)0x2596ef;
    Qt::endl((QTextStream *)&local_148);
    if (local_1a8.size != 0) {
      lVar28 = 0;
      uVar26 = 0;
      do {
        pPStackY_590 = (ProString *)0x259737;
        QVar34.m_data = (storage_type *)0x12;
        QVar34.m_size = (qsizetype)local_398;
        QString::fromUtf8(QVar34);
        local_478.a.a.m_string.d.d = (Data *)local_398._0_8_;
        local_478.a.a.m_string.d.ptr = (char16_t *)local_398._8_8_;
        local_478.a.a.m_string.d.size = local_398._16_8_;
        uVar26 = uVar26 + 1;
        pPStackY_590 = (ProString *)0x25977b;
        QString::arg_impl((longlong)&local_408,(int)local_4b8 + 0x40,(int)uVar26,(QChar)0x0);
        pPStackY_590 = (ProString *)0x259788;
        pQVar17 = QList<QString>::data((QList<QString> *)&local_1a8);
        pPStackY_590 = (ProString *)0x259794;
        cQuoted((QString *)local_4b8,(QString *)((long)&(pQVar17->d).d + lVar28));
        pPStackY_590 = (ProString *)0x2597c9;
        QVar35.m_size = (size_t)&local_408;
        QVar35.field_0.m_data_utf8 = local_398;
        QString::arg_impl(QVar35,(int)local_4b8._8_8_,(QChar)(char16_t)local_4b8._16_8_);
        pPStackY_590 = (ProString *)0x2597d4;
        pQVar18 = (QTextStream *)
                  QTextStream::operator<<((QTextStream *)&local_148,(QString *)local_398);
        pPStackY_590 = (ProString *)0x2597dc;
        Qt::endl(pQVar18);
        if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            pPStackY_590 = (ProString *)0x259805;
            QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            pPStackY_590 = (ProString *)0x25982e;
            QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
          }
        }
        if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            pPStackY_590 = (ProString *)0x259857;
            QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            pPStackY_590 = (ProString *)0x259880;
            QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        lVar28 = lVar28 + 0x18;
      } while (uVar26 < (ulong)local_1a8.size);
      pPStackY_590 = (ProString *)0x25989f;
      Qt::endl((QTextStream *)&local_148);
    }
    pMVar49 = pMVar29;
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      local_478.a.a.m_string.d.d = (Data *)0x0;
      local_478.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_478.a.a.m_string.d.size = 0;
      pQVar24 = pMVar29->project;
      pPStackY_590 = (ProString *)0x2598e8;
      ProKey::ProKey((ProKey *)&local_408,"TEMPLATE");
      pPStackY_590 = (ProString *)0x2598fe;
      QMakeEvaluator::first
                ((ProString *)local_398,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
      pPStackY_590 = (ProString *)0x25990d;
      bVar11 = ProString::operator==((ProString *)local_398,"lib");
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x259933;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
      if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_590 = (ProString *)0x25995c;
          QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pDVar5 = local_478.a.a.m_string.d.d;
      local_478.a.a.m_string.d.d = (Data *)0x0;
      if (bVar11) {
        local_478.a.a.m_string.d.ptr = L"ISOLATIONAWARE_MANIFEST_RESOURCE_ID";
        local_478.a.a.m_string.d.size = 0x23;
      }
      else {
        local_478.a.a.m_string.d.ptr = L"CREATEPROCESS_MANIFEST_RESOURCE_ID";
        local_478.a.a.m_string.d.size = 0x22;
      }
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x2599c5;
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
      pPStackY_590 = (ProString *)0x2599dd;
      pQVar18 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_148,(QString *)(local_4b8 + 0x40));
      pPStackY_590 = (ProString *)0x2599ec;
      pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18," RT_MANIFEST \"");
      pPStackY_590 = (ProString *)0x2599fc;
      pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_58);
      pPStackY_590 = (ProString *)0x259a0b;
      QTextStream::operator<<(pQVar18,"\"\n");
      if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_590 = (ProString *)0x259a2f;
          QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    pPStackY_590 = (ProString *)0x259a46;
    QTextStream::operator<<((QTextStream *)&local_148,"VS_VERSION_INFO VERSIONINFO\n");
    pPStackY_590 = (ProString *)0x259a55;
    pQVar18 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_148,"\tFILEVERSION ");
    local_408.a.a.m_string.d.d = (Data *)local_188;
    local_408.a.a.m_string.d.ptr = (char16_t *)pDStack_180;
    local_408.a.a.m_string.d.size = (qsizetype)local_178;
    if (local_188 != (QArrayData *)0x0) {
      LOCK();
      (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_188->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pPStackY_590 = (ProString *)0x259a9c;
    QVar36.m_data = (storage_type *)0x1;
    QVar36.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar36);
    local_478.a.a.m_string.d.d = (Data *)local_398._0_8_;
    local_478.a.a.m_string.d.ptr = (char16_t *)local_398._8_8_;
    local_478.a.a.m_string.d.size = local_398._16_8_;
    pPStackY_590 = (ProString *)0x259ad0;
    QVar37.m_data = (storage_type *)0x1;
    QVar37.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar37);
    local_4b8._0_8_ = local_398._0_8_;
    local_4b8._8_8_ = local_398._8_8_;
    local_4b8._16_8_ = local_398._16_8_;
    pPStackY_590 = (ProString *)0x259b02;
    pQVar19 = (QString *)
              QString::replace((QString *)&local_408,(QString *)(local_4b8 + 0x40),
                               (CaseSensitivity)local_4b8);
    pPStackY_590 = (ProString *)0x259b0d;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,pQVar19);
    pPStackY_590 = (ProString *)0x259b15;
    Qt::endl(pQVar18);
    if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x259b3a;
        QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
      }
    }
    if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x259b63;
        QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x259b8c;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x259ba0;
    pQVar18 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_148,"\tPRODUCTVERSION ");
    local_408.a.a.m_string.d.d = (Data *)local_188;
    local_408.a.a.m_string.d.ptr = (char16_t *)pDStack_180;
    local_408.a.a.m_string.d.size = (qsizetype)local_178;
    if (local_188 != (QArrayData *)0x0) {
      LOCK();
      (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_188->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pPStackY_590 = (ProString *)0x259be7;
    QVar38.m_data = (storage_type *)0x1;
    QVar38.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar38);
    local_478.a.a.m_string.d.d = (Data *)local_398._0_8_;
    local_478.a.a.m_string.d.ptr = (char16_t *)local_398._8_8_;
    local_478.a.a.m_string.d.size = local_398._16_8_;
    pPStackY_590 = (ProString *)0x259c1b;
    QVar39.m_data = (storage_type *)0x1;
    QVar39.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar39);
    local_4b8._0_8_ = local_398._0_8_;
    local_4b8._8_8_ = local_398._8_8_;
    local_4b8._16_8_ = local_398._16_8_;
    pPStackY_590 = (ProString *)0x259c4d;
    pQVar19 = (QString *)
              QString::replace((QString *)&local_408,(QString *)(local_4b8 + 0x40),
                               (CaseSensitivity)local_4b8);
    pPStackY_590 = (ProString *)0x259c58;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,pQVar19);
    pPStackY_590 = (ProString *)0x259c60;
    Qt::endl(pQVar18);
    if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x259c85;
        QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
      }
    }
    if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x259cae;
        QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x259cd7;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x259cee;
    QTextStream::operator<<((QTextStream *)&local_148,"\tFILEFLAGSMASK 0x3fL\n");
    pPStackY_590 = (ProString *)0x259cfd;
    QTextStream::operator<<((QTextStream *)&local_148,"#ifdef _DEBUG\n");
    pPStackY_590 = (ProString *)0x259d0c;
    QTextStream::operator<<((QTextStream *)&local_148,"\tFILEFLAGS VS_FF_DEBUG\n");
    pPStackY_590 = (ProString *)0x259d1b;
    QTextStream::operator<<((QTextStream *)&local_148,"#else\n");
    pPStackY_590 = (ProString *)0x259d2a;
    QTextStream::operator<<((QTextStream *)&local_148,"\tFILEFLAGS 0x0L\n");
    pPStackY_590 = (ProString *)0x259d39;
    QTextStream::operator<<((QTextStream *)&local_148,"#endif\n");
    pPStackY_590 = (ProString *)0x259d48;
    QTextStream::operator<<((QTextStream *)&local_148,"\tFILEOS VOS_NT_WINDOWS32\n");
    pQVar24 = pMVar29->project;
    pPStackY_590 = (ProString *)0x259d6b;
    QVar40.m_data = (storage_type *)0x6;
    QVar40.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar40);
    uVar9 = local_398._0_8_;
    pPStackY_590 = (ProString *)0x259d80;
    config_00.m_data = (storage_type_conflict *)local_398._8_8_;
    config_00.m_size = local_398._16_8_;
    bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_00,false);
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x259d9e;
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    pcVar27 = "\tFILETYPE VFT_APP\n";
    if (bVar11) {
      pcVar27 = "\tFILETYPE VFT_DLL\n";
    }
    pPStackY_590 = (ProString *)0x259dc3;
    QTextStream::operator<<((QTextStream *)&local_148,pcVar27);
    pPStackY_590 = (ProString *)0x259dd2;
    QTextStream::operator<<((QTextStream *)&local_148,"\tFILESUBTYPE VFT2_UNKNOWN\n");
    pPStackY_590 = (ProString *)0x259de1;
    QTextStream::operator<<((QTextStream *)&local_148,"\tBEGIN\n");
    pPStackY_590 = (ProString *)0x259df0;
    QTextStream::operator<<((QTextStream *)&local_148,"\t\tBLOCK \"StringFileInfo\"\n");
    pPStackY_590 = (ProString *)0x259dff;
    QTextStream::operator<<((QTextStream *)&local_148,"\t\tBEGIN\n");
    pPStackY_590 = (ProString *)0x259e0e;
    pQVar18 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_148,"\t\t\tBLOCK \"");
    pPStackY_590 = (ProString *)0x259e2d;
    QVar41.m_data = (storage_type *)0x4;
    QVar41.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar41);
    local_478.a.a.m_string.d.d = (Data *)local_398._0_8_;
    local_478.a.a.m_string.d.ptr = (char16_t *)local_398._8_8_;
    local_478.a.a.m_string.d.size = local_398._16_8_;
    pPStackY_590 = (ProString *)0x259e6d;
    iVar25 = iVar14;
    QString::arg_impl((longlong)&local_408,(int)local_4b8 + 0x40,iVar14,(QChar)0x4);
    pPStackY_590 = (ProString *)0x259e99;
    QString::arg_impl((longlong)local_398,(int)&local_408,iVar15,(QChar)0x4);
    pPStackY_590 = (ProString *)0x259ea4;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)local_398);
    pPStackY_590 = (ProString *)0x259eb3;
    QTextStream::operator<<(pQVar18,"\"\n");
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x259ed8;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    pMVar29 = pMVar49;
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x259f06;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x259f2f;
        QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x259f46;
    QTextStream::operator<<((QTextStream *)&local_148,"\t\t\tBEGIN\n");
    pPStackY_590 = (ProString *)0x259f55;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_148,"\t\t\t\tVALUE \"CompanyName\", \"")
    ;
    pPStackY_590 = (ProString *)0x259f65;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_1e8);
    pPStackY_590 = (ProString *)0x259f77;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x259f86;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_148,"\t\t\t\tVALUE \"FileDescription\", \"");
    pPStackY_590 = (ProString *)0x259f96;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_208);
    pPStackY_590 = (ProString *)0x259fa1;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x259fb0;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_148,"\t\t\t\tVALUE \"FileVersion\", \"")
    ;
    pPStackY_590 = (ProString *)0x259fc3;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_188);
    pPStackY_590 = (ProString *)0x259fce;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x259fdd;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_148,"\t\t\t\tVALUE \"LegalCopyright\", \"");
    pPStackY_590 = (ProString *)0x259fed;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_228);
    pPStackY_590 = (ProString *)0x259ff8;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x25a007;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_148,"\t\t\t\tVALUE \"OriginalFilename\", \"");
    pPStackY_590 = (ProString *)0x25a017;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_268);
    pPStackY_590 = (ProString *)0x25a022;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x25a031;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_148,"\t\t\t\tVALUE \"ProductName\", \"")
    ;
    pPStackY_590 = (ProString *)0x25a041;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_248);
    pPStackY_590 = (ProString *)0x25a04c;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x25a05b;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_148,"\t\t\t\tVALUE \"ProductVersion\", \"");
    pPStackY_590 = (ProString *)0x25a066;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_188);
    pPStackY_590 = (ProString *)0x25a071;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x25a080;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_148,"\t\t\t\tVALUE \"InternalName\", \"");
    pPStackY_590 = (ProString *)0x25a090;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_2b8);
    pPStackY_590 = (ProString *)0x25a09b;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x25a0aa;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_148,"\t\t\t\tVALUE \"Comments\", \"");
    pPStackY_590 = (ProString *)0x25a0ba;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_2d8);
    pPStackY_590 = (ProString *)0x25a0c5;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x25a0d4;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_148,"\t\t\t\tVALUE \"LegalTrademarks\", \"");
    pPStackY_590 = (ProString *)0x25a0e4;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_2f8);
    pPStackY_590 = (ProString *)0x25a0ef;
    QTextStream::operator<<(pQVar18,"\\0\"\n");
    pPStackY_590 = (ProString *)0x25a0fe;
    QTextStream::operator<<((QTextStream *)&local_148,"\t\t\tEND\n");
    pPStackY_590 = (ProString *)0x25a10d;
    QTextStream::operator<<((QTextStream *)&local_148,"\t\tEND\n");
    pPStackY_590 = (ProString *)0x25a11c;
    QTextStream::operator<<((QTextStream *)&local_148,"\t\tBLOCK \"VarFileInfo\"\n");
    pPStackY_590 = (ProString *)0x25a12b;
    QTextStream::operator<<((QTextStream *)&local_148,"\t\tBEGIN\n");
    pPStackY_590 = (ProString *)0x25a13a;
    pQVar18 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_148,"\t\t\tVALUE \"Translation\", ");
    pPStackY_590 = (ProString *)0x25a159;
    QVar42.m_data = (storage_type *)0x4;
    QVar42.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar42);
    local_478.a.a.m_string.d.d = (Data *)local_398._0_8_;
    local_478.a.a.m_string.d.ptr = (char16_t *)local_398._8_8_;
    local_478.a.a.m_string.d.size = local_398._16_8_;
    pPStackY_590 = (ProString *)0x25a196;
    QString::arg_impl((longlong)&local_408,(int)local_4b8 + 0x40,iVar14,(QChar)0x4);
    pPStackY_590 = (ProString *)0x25a1a1;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_408);
    pPStackY_590 = (ProString *)0x25a1b0;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,", ");
    pPStackY_590 = (ProString *)0x25a1cf;
    QVar43.m_data = (storage_type *)0x2;
    QVar43.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar43);
    local_4b8._0_8_ = local_398._0_8_;
    local_4b8._8_8_ = local_398._8_8_;
    local_4b8._16_8_ = local_398._16_8_;
    pPStackY_590 = (ProString *)0x25a20a;
    QString::arg_impl((longlong)local_398,(int)local_4b8,iVar15,(QChar)0x4);
    pPStackY_590 = (ProString *)0x25a215;
    pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)local_398);
    pPStackY_590 = (ProString *)0x25a21d;
    Qt::endl(pQVar18);
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a241;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a26a;
        QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
      }
    }
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25a293;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25a2bc;
        QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x25a2d3;
    QTextStream::operator<<((QTextStream *)&local_148,"\t\tEND\n");
    pPStackY_590 = (ProString *)0x25a2e2;
    QTextStream::operator<<((QTextStream *)&local_148,"\tEND\n");
    pPStackY_590 = (ProString *)0x25a2f1;
    QTextStream::operator<<((QTextStream *)&local_148,"/* End of Version info */\n");
    pPStackY_590 = (ProString *)0x25a2f9;
    Qt::endl((QTextStream *)&local_148);
    pPStackY_590 = (ProString *)0x25a301;
    QTextStream::flush();
    local_318.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_318.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_318.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x25a33f;
    ProKey::ProKey(&local_4e8,"OUT_PWD");
    pPStackY_590 = (ProString *)0x25a355;
    QMakeEvaluator::first(&local_298,&pQVar24->super_QMakeEvaluator,&local_4e8);
    pPStackY_590 = (ProString *)0x25a368;
    ProString::ProString((ProString *)local_4b8,&local_298);
    local_4b8._48_8_ = "/";
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x25a38e;
    ProKey::ProKey(&local_548,"TARGET");
    pPStackY_590 = (ProString *)0x25a3a1;
    QMakeEvaluator::first(&local_518,&pQVar24->super_QMakeEvaluator,&local_548);
    this_00 = (QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
              (local_4b8 + 0x40);
    pPStackY_590 = (ProString *)0x25a3b4;
    ProString::ProString((ProString *)this_00,(ProString *)local_4b8);
    local_478.a.b = (char (*) [2])local_4b8._48_8_;
    pPStackY_590 = (ProString *)0x25a3cf;
    ProString::ProString(&local_478.b,&local_518);
    pPStackY_590 = (ProString *)0x25a3e2;
    ProString::ProString((ProString *)&local_408,(ProString *)this_00);
    local_408.a.b = local_478.a.b;
    pPStackY_590 = (ProString *)0x25a3fe;
    ProString::ProString(&local_408.b,&local_478.b);
    local_3a0 = (char (*) [10])0x2b57fe;
    pPStackY_590 = (ProString *)0x25a41c;
    ProString::ProString((ProString *)local_398,(ProString *)&local_408);
    local_398._48_8_ = local_408.a.b;
    pPStackY_590 = (ProString *)0x25a437;
    ProString::ProString(&local_360,&local_408.b);
    local_330 = local_3a0;
    local_328 = (char (*) [4])0x2b2015;
    pPStackY_590 = (ProString *)0x25a45a;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>,_const_char_(&)[4]>
    ::convertTo<QString>
              (&local_318,
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>,_const_char_(&)[4]>
                *)local_398);
    pPStackY_590 = (ProString *)0x25a462;
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)local_398)
    ;
    pPStackY_590 = (ProString *)0x25a46a;
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              (&local_408);
    pPStackY_590 = (ProString *)0x25a472;
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              (this_00);
    if (&(local_518.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_518.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_518.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_518.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_590 = (ProString *)0x25a493;
        QArrayData::deallocate(&(local_518.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_548.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_548.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_548.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_548.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a4b6;
        QArrayData::deallocate(&(local_548.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pMVar49 = pMVar29;
    if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a4e4;
        QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
      }
    }
    if (&(local_298.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_590 = (ProString *)0x25a50d;
        QArrayData::deallocate(&(local_298.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_4e8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_4e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_4e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a536;
        QArrayData::deallocate(&(local_4e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_4b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_4b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pPStackY_590 = (ProString *)0x25a560;
    QDir::cleanPath((QString *)local_398);
    pPStackY_590 = (ProString *)0x25a56b;
    QFile::QFile((QFile *)local_4b8,(QString *)local_398);
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a58f;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x25a59c;
    cVar12 = QFile::exists();
    if (cVar12 == '\0') {
LAB_0025a705:
      pPStackY_590 = (ProString *)0x25a717;
      cVar12 = QFile::open(local_4b8,2);
      if (cVar12 == '\0') {
        local_398._0_8_ = (QArrayData *)0x0;
        local_398._8_8_ = (Data *)0x0;
        local_398._16_8_ = (Data *)0x0;
        this_02 = (QDir *)(local_4b8 + 0x40);
        pPStackY_590 = (ProString *)0x25a745;
        QDir::QDir(this_02,(QString *)local_398);
        pPVar23 = &local_298;
        pPStackY_590 = (ProString *)0x25a75d;
        QFileInfo::QFileInfo((QFileInfo *)pPVar23,(QFileDevice *)local_4b8);
        pPStackY_590 = (ProString *)0x25a770;
        QFileInfo::path();
        pPStackY_590 = (ProString *)0x25a77d;
        QDir::mkpath(this_02,&local_408,0);
        if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            pPStackY_590 = (ProString *)0x25a7a1;
            QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pPStackY_590 = (ProString *)0x25a7ae;
        QFileInfo::~QFileInfo((QFileInfo *)&local_298);
        pPStackY_590 = (ProString *)0x25a7bb;
        QDir::~QDir((QDir *)(local_4b8 + 0x40));
        if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            pPStackY_590 = (ProString *)0x25a7e4;
            QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
          }
        }
        this_03 = (ProString *)0x2;
        pPStackY_590 = (ProString *)0x25a7f6;
        cVar12 = QFile::open(local_4b8);
        if (cVar12 == '\0') goto LAB_0025b60c;
      }
      pPStackY_590 = (ProString *)0x25a816;
      QIODevice::write((QByteArray *)local_4b8);
      pPStackY_590 = (ProString *)0x25a81e;
      QFileDevice::close();
    }
    else {
      pPStackY_590 = (ProString *)0x25a5b6;
      cVar12 = QFile::open(local_4b8,1);
      if (cVar12 == '\0') goto LAB_0025a705;
      pPStackY_590 = (ProString *)0x25a5d6;
      QIODevice::readAll();
      bVar11 = true;
      pMVar29 = pMVar49;
      if ((Data *)local_398._16_8_ == local_128) {
        if (local_128 == (Data *)0x0) {
          bVar11 = false;
        }
        else {
          pPStackY_590 = (ProString *)0x25a609;
          iVar14 = bcmp((void *)local_398._8_8_,pvStack_130,(size_t)local_128);
          bVar11 = iVar14 != 0;
          pMVar29 = pMVar49;
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x25a6ea;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,1,0x10);
        }
      }
      pPStackY_590 = (ProString *)0x25a6f7;
      QFileDevice::close();
      pMVar49 = pMVar29;
      if (bVar11) goto LAB_0025a705;
    }
    pQVar24 = pMVar29->project;
    pPStackY_590 = (ProString *)0x25a83c;
    ProKey::ProKey((ProKey *)local_398,"QMAKE_WRITE_DEFAULT_RC");
    pPStackY_590 = (ProString *)0x25a847;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    lVar28 = (pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a86f;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (lVar28 == 0) {
      pQVar24 = pMVar29->project;
      pPStackY_590 = (ProString *)0x25b531;
      ProKey::ProKey((ProKey *)local_398,"RC_FILE");
      pPStackY_590 = (ProString *)0x25b53c;
      pQVar20 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398)->
                 super_QList<ProString>;
      pPStackY_590 = (ProString *)0x25b557;
      QFile::fileName();
      pPStackY_590 = (ProString *)0x25b56a;
      ProString::ProString((ProString *)&local_408,(QString *)(local_4b8 + 0x40));
      pPStackY_590 = (ProString *)0x25b577;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar20,0,(ProString *)&local_408);
      pPStackY_590 = (ProString *)0x25b57f;
      QList<ProString>::begin(pQVar20);
      if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_590 = (ProString *)0x25b5a3;
          QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_590 = (ProString *)0x25b5cc;
          QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x25b5fd;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
    }
    pPStackY_590 = (ProString *)0x25a885;
    QFile::~QFile((QFile *)local_4b8);
    if (&(local_318.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a8ae;
        QArrayData::deallocate(&(local_318.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_2f8 != (QArrayData *)0x0) {
      LOCK();
      (local_2f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a8d7;
        QArrayData::deallocate(local_2f8,2,0x10);
      }
    }
    if (local_2d8 != (QArrayData *)0x0) {
      LOCK();
      (local_2d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a900;
        QArrayData::deallocate(local_2d8,2,0x10);
      }
    }
    if (local_2b8 != (QArrayData *)0x0) {
      LOCK();
      (local_2b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a929;
        QArrayData::deallocate(local_2b8,2,0x10);
      }
    }
    if (local_268 != (QArrayData *)0x0) {
      LOCK();
      (local_268->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_268->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_268->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a952;
        QArrayData::deallocate(local_268,2,0x10);
      }
    }
    if (local_248 != (QArrayData *)0x0) {
      LOCK();
      (local_248->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_248->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_248->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a97b;
        QArrayData::deallocate(local_248,2,0x10);
      }
    }
    if (local_228 != (QArrayData *)0x0) {
      LOCK();
      (local_228->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_228->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_228->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a9a4;
        QArrayData::deallocate(local_228,2,0x10);
      }
    }
    if (local_208 != (QArrayData *)0x0) {
      LOCK();
      (local_208->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_208->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_208->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a9cd;
        QArrayData::deallocate(local_208,2,0x10);
      }
    }
    if (local_1e8 != (QArrayData *)0x0) {
      LOCK();
      (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25a9f6;
        QArrayData::deallocate(local_1e8,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x25aa03;
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1c8);
    pPStackY_590 = (ProString *)0x25aa10;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_1a8);
    if (local_188 != (QArrayData *)0x0) {
      LOCK();
      (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_188->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_188->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25aa39;
        QArrayData::deallocate(local_188,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x25aa46;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_168);
    pPStackY_590 = (ProString *)0x25aa53;
    QTextStream::~QTextStream((QTextStream *)&local_148);
    if (local_138 != (QArrayData *)0x0) {
      LOCK();
      (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25aa7c;
        QArrayData::deallocate(local_138,1,0x10);
      }
    }
  }
  pQVar24 = pMVar29->project;
  pPStackY_590 = (ProString *)0x25aa9a;
  ProKey::ProKey((ProKey *)local_398,"RC_FILE");
  pPStackY_590 = (ProString *)0x25aaa5;
  pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
  lVar28 = (pPVar16->super_QList<ProString>).d.size;
  if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      pPStackY_590 = (ProString *)0x25aacd;
      QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
    }
  }
  if (lVar28 != 0) {
    pQVar24 = pMVar29->project;
    pPVar23 = (ProString *)local_398;
    pPStackY_590 = (ProString *)0x25aaf4;
    ProKey::ProKey((ProKey *)pPVar23,"RES_FILE");
    pPStackY_590 = (ProString *)0x25aaff;
    this_03 = pPVar23;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)pPVar23);
    this_02 = (QDir *)(pPVar16->super_QList<ProString>).d.size;
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        this_03 = (ProString *)0x2;
        pPStackY_590 = (ProString *)0x25ab27;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (this_02 != (QDir *)0x0) {
      pPStackY_590 = (ProString *)0x25b60c;
      processRcFileVar();
LAB_0025b60c:
      this_04 = (ProString *)local_4b8;
      pPStackY_590 = (ProString *)0x25b619;
      processRcFileVar((Win32MakefileGenerator *)this_04);
      lStackY_5a0 = *(long *)(in_FS_OFFSET + 0x28);
      pQStackY_598 = this_02;
      pPStackY_590 = pPVar23;
      QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>
                (&QStackY_5b8,(QStringBuilder<QLatin1String,_QString_&> *)this_03);
      ProString::ProString(this_04,&QStackY_5b8);
      if (&(QStackY_5b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((QStackY_5b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((QStackY_5b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((QStackY_5b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(QStackY_5b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lStackY_5a0) {
        return;
      }
      __stack_chk_fail();
    }
    local_298.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_298.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_298.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar24 = pMVar29->project;
    pPStackY_590 = (ProString *)0x25ab6e;
    ProKey::ProKey((ProKey *)&local_408,"RC_FILE");
    pPStackY_590 = (ProString *)0x25ab84;
    QMakeEvaluator::first
              ((ProString *)local_398,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
    pPStackY_590 = (ProString *)0x25ab8f;
    ProString::toQString(&local_298.m_string,(ProString *)local_398);
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25abb4;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25abdd;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x25abed;
    qmake_getpwd();
    bVar13 = 1;
    if (Option::output_dir.d.size == local_398._16_8_) {
      pPStackY_590 = (ProString *)0x25ac14;
      QVar45.m_data = Option::output_dir.d.ptr;
      QVar45.m_size = Option::output_dir.d.size;
      QVar48.m_data = (storage_type_conflict *)local_398._8_8_;
      QVar48.m_size = Option::output_dir.d.size;
      bVar13 = QtPrivate::equalStrings(QVar45,QVar48);
      bVar13 = bVar13 ^ 1;
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25ac42;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (bVar13 != 0) {
      local_4b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pPStackY_590 = (ProString *)0x25ac6f;
      QFileInfo::QFileInfo((QFileInfo *)local_4b8,(QString *)&local_298);
      pPStackY_590 = (ProString *)0x25ac82;
      QFileInfo::absoluteFilePath();
      pPStackY_590 = (ProString *)0x25ac95;
      ProString::ProString((ProString *)local_398,(QString *)(local_4b8 + 0x40));
      pQVar24 = pMVar29->project;
      pPStackY_590 = (ProString *)0x25acb3;
      ProKey::ProKey((ProKey *)&local_408,"RC_FILE");
      pPStackY_590 = (ProString *)0x25acbe;
      pQVar20 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408)->
                 super_QList<ProString>;
      pPStackY_590 = (ProString *)0x25acc6;
      iVar21 = QList<ProString>::begin(pQVar20);
      pPStackY_590 = (ProString *)0x25acd4;
      QString::operator=(&(iVar21.i)->m_string,(QString *)local_398);
      (iVar21.i)->m_hash = local_398._40_8_;
      (iVar21.i)->m_offset = local_398._24_4_;
      (iVar21.i)->m_length = local_398._28_4_;
      *(undefined8 *)&(iVar21.i)->m_file = local_398._32_8_;
      if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_590 = (ProString *)0x25ad09;
          QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x25ad32;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
      if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_590 = (ProString *)0x25ad5b;
          QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pPStackY_590 = (ProString *)0x25ad68;
      QFileInfo::~QFileInfo((QFileInfo *)local_4b8);
    }
    pPStackY_590 = (ProString *)0x25ad91;
    QVar46.m_data = (char *)0x3;
    QVar46.m_size = (qsizetype)&local_298;
    QString::replace(QVar46,(QString *)0x2b2015,0x2e5c70);
    pQVar24 = pMVar29->project;
    pPStackY_590 = (ProString *)0x25adaf;
    ProKey::ProKey((ProKey *)local_398,"RES_FILE");
    pPStackY_590 = (ProString *)0x25adba;
    this_01 = (QMovableArrayOps<ProString> *)
              QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    pDVar5 = local_298.m_string.d.d;
    if (&(local_298.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    pPStackY_590 = (ProString *)0x25adef;
    file.d.ptr = (char16_t *)pMVar49;
    file.d.d = (Data *)in_stack_fffffffffffffa78;
    file.d.size._0_4_ = iVar25;
    file.d.size._4_4_ = uVar50;
    MakefileGenerator::fileInfo((MakefileGenerator *)local_4b8,file);
    pPStackY_590 = (ProString *)0x25ae02;
    QFileInfo::fileName();
    pPStackY_590 = (ProString *)0x25ae15;
    ProString::ProString((ProString *)&local_408,(QString *)(local_4b8 + 0x40));
    pPStackY_590 = (ProString *)0x25ae22;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>(this_01,0,(ProString *)&local_408);
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25ae46;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25ae6f;
        QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x25ae7c;
    QFileInfo::~QFileInfo((QFileInfo *)local_4b8);
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25ae9f;
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25aec8;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    local_4e8.super_ProString.m_string.d.d = (Data *)0x0;
    local_4e8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_4e8.super_ProString.m_string.d.size = 0;
    pQVar24 = pMVar29->project;
    pPStackY_590 = (ProString *)0x25af02;
    QVar47.m_data = (storage_type *)0x9;
    QVar47.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar47);
    uVar9 = local_398._0_8_;
    pPStackY_590 = (ProString *)0x25af17;
    config_02.m_data = (storage_type_conflict *)local_398._8_8_;
    config_02.m_size = local_398._16_8_;
    bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_02,false);
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25af35;
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if (bVar11) {
      pQVar24 = pMVar49->project;
      pcVar27 = "DESTDIR";
    }
    else {
      pQVar24 = pMVar49->project;
      pcVar27 = "OBJECTS_DIR";
    }
    pPStackY_590 = (ProString *)0x25af74;
    pMVar29 = pMVar49;
    ProKey::ProKey((ProKey *)&local_408,pcVar27);
    pPStackY_590 = (ProString *)0x25af8a;
    QMakeEvaluator::first
              ((ProString *)local_398,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
    pPStackY_590 = (ProString *)0x25af9d;
    ProString::toQString((QString *)(local_4b8 + 0x40),(ProString *)local_398);
    qVar7 = local_478.a.a.m_string.d.size;
    pDVar8 = local_478.a.a.m_string.d.d;
    pcVar6 = local_4e8.super_ProString.m_string.d.ptr;
    pDVar5 = local_4e8.super_ProString.m_string.d.d;
    local_478.a.a.m_string.d.d = local_4e8.super_ProString.m_string.d.d;
    local_4e8.super_ProString.m_string.d.d = pDVar8;
    local_4e8.super_ProString.m_string.d.ptr = local_478.a.a.m_string.d.ptr;
    local_478.a.a.m_string.d.ptr = pcVar6;
    local_478.a.a.m_string.d.size = local_4e8.super_ProString.m_string.d.size;
    local_4e8.super_ProString.m_string.d.size = qVar7;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25afec;
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25b015;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25b03e;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((Data *)local_4e8.super_ProString.m_string.d.size != (Data *)0x0) {
      pPStackY_590 = (ProString *)0x25b064;
      QString::append((QString *)&local_4e8);
      pQVar24 = pMVar49->project;
      pPStackY_590 = (ProString *)0x25b083;
      ProKey::ProKey((ProKey *)local_398,"RES_FILE");
      pPStackY_590 = (ProString *)0x25b08e;
      pQVar20 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398)->
                 super_QList<ProString>;
      pPStackY_590 = (ProString *)0x25b096;
      iVar21 = QList<ProString>::begin(pQVar20);
      pPStackY_590 = (ProString *)0x25b0ac;
      ProString::ProString((ProString *)&local_408,(QString *)&local_4e8);
      pPStackY_590 = (ProString *)0x25b0b7;
      ProString::prepend(iVar21.i,(ProString *)&local_408);
      if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_590 = (ProString *)0x25b0db;
          QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_590 = (ProString *)0x25b104;
          QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
        }
      }
    }
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x25b123;
    ProKey::ProKey((ProKey *)(local_4b8 + 0x40),"RES_FILE");
    pPStackY_590 = (ProString *)0x25b139;
    QMakeEvaluator::first
              ((ProString *)&local_408,&pQVar24->super_QMakeEvaluator,(ProKey *)(local_4b8 + 0x40));
    pPStackY_590 = (ProString *)0x25b149;
    ProString::toQString((QString *)&local_548,(ProString *)&local_408);
    local_398._0_8_ = local_548.super_ProString.m_string.d.d;
    local_398._8_8_ = local_548.super_ProString.m_string.d.ptr;
    local_398._16_8_ = local_548.super_ProString.m_string.d.size;
    if (&(local_548.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_548.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_548.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pPStackY_590 = (ProString *)0x25b182;
    string.d.ptr = (char16_t *)pMVar29;
    string.d.d = (Data *)in_stack_fffffffffffffa78;
    string.d.size._0_4_ = iVar25;
    string.d.size._4_4_ = uVar50;
    Option::fixString(&local_518.m_string,string,(uchar)local_398);
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25b1a6;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    pPStackY_590 = (ProString *)0x25b1bb;
    ProString::ProString((ProString *)local_398,&local_518.m_string);
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x25b1da;
    ProKey::ProKey((ProKey *)local_4b8,"RES_FILE");
    pPStackY_590 = (ProString *)0x25b1e5;
    pQVar20 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_4b8)->
               super_QList<ProString>;
    pPStackY_590 = (ProString *)0x25b1ed;
    iVar21 = QList<ProString>::begin(pQVar20);
    pPStackY_590 = (ProString *)0x25b1fb;
    QString::operator=(&(iVar21.i)->m_string,(QString *)local_398);
    (iVar21.i)->m_hash = local_398._40_8_;
    (iVar21.i)->m_offset = local_398._24_4_;
    (iVar21.i)->m_length = local_398._28_4_;
    *(undefined8 *)&(iVar21.i)->m_file = local_398._32_8_;
    if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25b230;
        QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25b259;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (&(local_518.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_518.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_518.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_518.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_590 = (ProString *)0x25b27c;
        QArrayData::deallocate(&(local_518.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_548.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_548.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_548.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_548.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25b29f;
        QArrayData::deallocate(&(local_548.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25b2c8;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_478.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_478.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25b2f1;
        QArrayData::deallocate(&(local_478.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x25b310;
    ProKey::ProKey((ProKey *)local_398,"RES_FILE");
    pPStackY_590 = (ProString *)0x25b31b;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x25b33d;
    ProKey::ProKey((ProKey *)&local_408,"POST_TARGETDEPS");
    pPStackY_590 = (ProString *)0x25b348;
    pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
    pPVar23 = (pPVar16->super_QList<ProString>).d.ptr;
    pPStackY_590 = (ProString *)0x25b363;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar22,pPVar23,
               pPVar23 + (pPVar16->super_QList<ProString>).d.size);
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25b387;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25b3b0;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x25b3cf;
    ProKey::ProKey((ProKey *)local_398,"RES_FILE");
    pPStackY_590 = (ProString *)0x25b3da;
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_398);
    pQVar24 = pMVar49->project;
    pPStackY_590 = (ProString *)0x25b3fc;
    ProKey::ProKey((ProKey *)&local_408,"CLEAN_FILES");
    pPStackY_590 = (ProString *)0x25b407;
    pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)&local_408);
    pPVar23 = (pPVar16->super_QList<ProString>).d.ptr;
    pPStackY_590 = (ProString *)0x25b422;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar22,pPVar23,
               pPVar23 + (pPVar16->super_QList<ProString>).d.size);
    if (&(local_408.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_408.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_590 = (ProString *)0x25b446;
        QArrayData::deallocate(&(local_408.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_398._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_398._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25b46f;
        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
      }
    }
    if (&(local_4e8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_4e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_4e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        pPStackY_590 = (ProString *)0x25b498;
        QArrayData::deallocate(&(local_4e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_298.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_298.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_590 = (ProString *)0x25b4c1;
        QArrayData::deallocate(&(local_298.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      pPStackY_590 = (ProString *)0x25b4ea;
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0025b4ea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  pPStackY_590 = (ProString *)0x25b607;
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::processRcFileVar()
{
    if (Option::qmake_mode == Option::QMAKE_GENERATE_NOTHING)
        return;

    const QString manifestFile = project->first("QMAKE_MANIFEST").toQString();
    if (((!project->values("VERSION").isEmpty() || !project->values("RC_ICONS").isEmpty() || !manifestFile.isEmpty())
        && project->values("RC_FILE").isEmpty()
        && project->values("RES_FILE").isEmpty()
        && !project->isActiveConfig("no_generated_target_info")
        && (project->isActiveConfig("shared") || !project->values("QMAKE_APP_FLAG").isEmpty()))
        || !project->values("QMAKE_WRITE_DEFAULT_RC").isEmpty()){

        QByteArray rcString;
        QTextStream ts(&rcString, QFile::WriteOnly);

        QStringList vers = project->first("VERSION").toQString().split(".", Qt::SkipEmptyParts);
        for (int i = vers.size(); i < 4; i++)
            vers += "0";
        QString versionString = vers.join('.');

        QStringList rcIcons;
        const auto icons = project->values("RC_ICONS");
        rcIcons.reserve(icons.size());
        for (const ProString &icon : icons)
            rcIcons.append(fileFixify(icon.toQString(), FileFixifyAbsolute));

        QString companyName;
        if (!project->values("QMAKE_TARGET_COMPANY").isEmpty())
            companyName = project->values("QMAKE_TARGET_COMPANY").join(' ');

        QString description;
        if (!project->values("QMAKE_TARGET_DESCRIPTION").isEmpty())
            description = project->values("QMAKE_TARGET_DESCRIPTION").join(' ');

        QString copyright;
        if (!project->values("QMAKE_TARGET_COPYRIGHT").isEmpty())
            copyright = project->values("QMAKE_TARGET_COPYRIGHT").join(' ');

        QString productName;
        if (!project->values("QMAKE_TARGET_PRODUCT").isEmpty())
            productName = project->values("QMAKE_TARGET_PRODUCT").join(' ');
        else
            productName = project->first("TARGET").toQString();

        QString originalName;
        if (!project->values("QMAKE_TARGET_ORIGINAL_FILENAME").isEmpty())
            originalName = project->values("QMAKE_TARGET_ORIGINAL_FILENAME").join(' ');
        else
            originalName = project->first("TARGET") + project->first("TARGET_EXT");

        QString internalName;
        if (!project->values("QMAKE_TARGET_INTERNALNAME").isEmpty())
            internalName = project->values("QMAKE_TARGET_INTERNALNAME").join(' ');

        QString comments;
        if (!project->values("QMAKE_TARGET_COMMENTS").isEmpty())
            comments = project->values("QMAKE_TARGET_COMMENTS").join(' ');

        QString trademarks;
        if (!project->values("QMAKE_TARGET_TRADEMARKS").isEmpty())
            trademarks = project->values("QMAKE_TARGET_TRADEMARKS").join(' ');

        int rcLang = project->intValue("RC_LANG", 1033);            // default: English(USA)
        int rcCodePage = project->intValue("RC_CODEPAGE", 1200);    // default: Unicode

        ts << "#include <windows.h>\n";
        ts << Qt::endl;
        if (!rcIcons.isEmpty()) {
            for (int i = 0; i < rcIcons.size(); ++i)
                ts << QString("IDI_ICON%1\tICON\t%2").arg(i + 1).arg(cQuoted(rcIcons[i])) << Qt::endl;
            ts << Qt::endl;
        }
        if (!manifestFile.isEmpty()) {
            QString manifestResourceId;
            if (project->first("TEMPLATE") == "lib")
                manifestResourceId = QStringLiteral("ISOLATIONAWARE_MANIFEST_RESOURCE_ID");
            else
                manifestResourceId = QStringLiteral("CREATEPROCESS_MANIFEST_RESOURCE_ID");
            ts << manifestResourceId << " RT_MANIFEST \"" << manifestFile << "\"\n";
        }
        ts << "VS_VERSION_INFO VERSIONINFO\n";
        ts << "\tFILEVERSION " << QString(versionString).replace(".", ",") << Qt::endl;
        ts << "\tPRODUCTVERSION " << QString(versionString).replace(".", ",") << Qt::endl;
        ts << "\tFILEFLAGSMASK 0x3fL\n";
        ts << "#ifdef _DEBUG\n";
        ts << "\tFILEFLAGS VS_FF_DEBUG\n";
        ts << "#else\n";
        ts << "\tFILEFLAGS 0x0L\n";
        ts << "#endif\n";
        ts << "\tFILEOS VOS_NT_WINDOWS32\n";
        if (project->isActiveConfig("shared"))
            ts << "\tFILETYPE VFT_DLL\n";
        else
            ts << "\tFILETYPE VFT_APP\n";
        ts << "\tFILESUBTYPE VFT2_UNKNOWN\n";
        ts << "\tBEGIN\n";
        ts << "\t\tBLOCK \"StringFileInfo\"\n";
        ts << "\t\tBEGIN\n";
        ts << "\t\t\tBLOCK \""
           << QString("%1%2").arg(rcLang, 4, 16, QLatin1Char('0')).arg(rcCodePage, 4, 16, QLatin1Char('0'))
           << "\"\n";
        ts << "\t\t\tBEGIN\n";
        ts << "\t\t\t\tVALUE \"CompanyName\", \"" << companyName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"FileDescription\", \"" <<  description << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"FileVersion\", \"" << versionString << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"LegalCopyright\", \"" << copyright << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"OriginalFilename\", \"" << originalName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"ProductName\", \"" << productName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"ProductVersion\", \"" << versionString << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"InternalName\", \"" << internalName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"Comments\", \"" << comments << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"LegalTrademarks\", \"" << trademarks << "\\0\"\n";
        ts << "\t\t\tEND\n";
        ts << "\t\tEND\n";
        ts << "\t\tBLOCK \"VarFileInfo\"\n";
        ts << "\t\tBEGIN\n";
        ts << "\t\t\tVALUE \"Translation\", "
           << QString("0x%1").arg(rcLang, 4, 16, QLatin1Char('0'))
           << ", " << QString("%1").arg(rcCodePage, 4) << Qt::endl;
        ts << "\t\tEND\n";
        ts << "\tEND\n";
        ts << "/* End of Version info */\n";
        ts << Qt::endl;

        ts.flush();


        QString rcFilename = project->first("OUT_PWD")
                           + "/"
                           + project->first("TARGET")
                           + "_resource"
                           + ".rc";
        QFile rcFile(QDir::cleanPath(rcFilename));

        bool writeRcFile = true;
        if (rcFile.exists() && rcFile.open(QFile::ReadOnly)) {
            writeRcFile = rcFile.readAll() != rcString;
            rcFile.close();
        }
        if (writeRcFile) {
            bool ok;
            ok = rcFile.open(QFile::WriteOnly);
            if (!ok) {
                // The file can't be opened... try creating the containing
                // directory first (needed for clean shadow builds)
                QDir().mkpath(QFileInfo(rcFile).path());
                ok = rcFile.open(QFile::WriteOnly);
            }
            if (!ok) {
                ::fprintf(stderr, "Cannot open for writing: %s", rcFile.fileName().toLatin1().constData());
                ::exit(1);
            }
            rcFile.write(rcString);
            rcFile.close();
        }
        if (project->values("QMAKE_WRITE_DEFAULT_RC").isEmpty())
            project->values("RC_FILE").insert(0, rcFile.fileName());
    }
    if (!project->values("RC_FILE").isEmpty()) {
        if (!project->values("RES_FILE").isEmpty()) {
            fprintf(stderr, "Both rc and res file specified.\n");
            fprintf(stderr, "Please specify one of them, not both.");
            exit(1);
        }
        QString resFile = project->first("RC_FILE").toQString();

        // if this is a shadow build then use the absolute path of the rc file
        if (Option::output_dir != qmake_getpwd()) {
            QFileInfo fi(resFile);
            project->values("RC_FILE").first() = fi.absoluteFilePath();
        }

        resFile.replace(QLatin1String(".rc"), Option::res_ext);
        project->values("RES_FILE").prepend(fileInfo(resFile).fileName());
        QString resDestDir;
        if (project->isActiveConfig("staticlib"))
            resDestDir = project->first("DESTDIR").toQString();
        else
            resDestDir = project->first("OBJECTS_DIR").toQString();
        if (!resDestDir.isEmpty()) {
            resDestDir.append(Option::dir_sep);
            project->values("RES_FILE").first().prepend(resDestDir);
        }
        project->values("RES_FILE").first() = Option::fixPathToTargetOS(
                    project->first("RES_FILE").toQString(), false);
        project->values("POST_TARGETDEPS") += project->values("RES_FILE");
        project->values("CLEAN_FILES") += project->values("RES_FILE");
    }
}